

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O2

void __thiscall Fl_Graphics_Driver::gap(Fl_Graphics_Driver *this)

{
  XPoint *pXVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  lVar2 = (long)this->gap_;
  iVar4 = this->n;
  lVar3 = (long)iVar4;
  pXVar1 = this->p;
  while( true ) {
    iVar4 = iVar4 + -1;
    if (lVar3 <= lVar2 + 2) {
      this->n = this->gap_;
      return;
    }
    if ((pXVar1[lVar3 + -1].x != pXVar1[lVar2].x) || (pXVar1[lVar3 + -1].y != pXVar1[lVar2].y))
    break;
    lVar3 = lVar3 + -1;
    this->n = iVar4;
  }
  (*(this->super_Fl_Device)._vptr_Fl_Device[0x29])
            ((double)(int)pXVar1[lVar2].x,(double)(int)pXVar1[lVar2].y,this);
  this->gap_ = this->n;
  return;
}

Assistant:

void Fl_Graphics_Driver::gap() {
  while (n>gap_+2 && p[n-1].x == p[gap_].x && p[n-1].y == p[gap_].y) n--;
  if (n > gap_+2) {
    transformed_vertex((COORD_T)p[gap_].x, (COORD_T)p[gap_].y);
#if defined(WIN32)
    counts[numcount++] = n-gap_;
#endif
    gap_ = n;
  } else {
    n = gap_;
  }
}